

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O3

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::insert
          (BinaryHeap<Liby::WeakTimerHolder> *this,const_reference_type x)

{
  vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_> *this_00;
  BasicHandler *pBVar1;
  pointer pWVar2;
  long lVar3;
  ulong uVar4;
  pointer pWVar5;
  bool bVar6;
  __suseconds_t _Var7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar10 = this->size_;
  this_00 = &this->heap;
  lVar8 = (long)(this->heap).
                super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->heap).
                super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (lVar8 * -0x71c71c71c71c71c7 - 1U == (ulong)uVar10) {
    std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::resize
              (this_00,lVar8 * 0x1c71c71c71c71c72);
    uVar10 = this->size_;
  }
  uVar10 = uVar10 + 1;
  this->size_ = uVar10;
  if (uVar10 < 2) {
LAB_0010dc59:
    uVar9 = (ulong)uVar10;
  }
  else {
    uVar9 = (ulong)uVar10;
    do {
      uVar9 = uVar9 >> 1;
      pWVar2 = (this_00->
               super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pWVar5 = pWVar2 + uVar9;
      lVar8 = (x->timer_).timeout_.tv_.tv_sec;
      lVar3 = (pWVar5->timer_).timeout_.tv_.tv_sec;
      if (((lVar3 <= lVar8) &&
          ((lVar3 < lVar8 ||
           (*(__suseconds_t *)((long)&(pWVar5->timer_).timeout_.tv_ + 8) <=
            (x->timer_).timeout_.tv_.tv_usec)))) ||
         (uVar4 = (pWVar5->timer_).id_, uVar4 <= (x->timer_).id_)) goto LAB_0010dc59;
      pBVar1 = &pWVar2[uVar10].timer_.handler_;
      *(ulong *)((long)(pBVar1 + -1) + 8) = uVar4;
      _Var7 = *(__suseconds_t *)((long)&pWVar2[uVar9].timer_.timeout_.tv_ + 8);
      *(__time_t *)((long)(pBVar1 + -1) + 0x10) = pWVar2[uVar9].timer_.timeout_.tv_.tv_sec;
      *(__suseconds_t *)((long)(pBVar1 + -1) + 0x18) = _Var7;
      std::function<void_()>::operator=(pBVar1,&(pWVar5->timer_).handler_);
      *(element_type **)(pBVar1 + 1) =
           (pWVar5->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&pWVar2[uVar10].weakTimerPtr_.
                  super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &(pWVar5->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar6 = 3 < uVar10;
      uVar10 = (uint)uVar9;
    } while (bVar6);
  }
  pWVar5 = (this_00->
           super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = &pWVar5[uVar9].timer_.handler_;
  *(uint64_t *)((long)(pBVar1 + -1) + 8) = (x->timer_).id_;
  _Var7 = (x->timer_).timeout_.tv_.tv_usec;
  *(__time_t *)((long)(pBVar1 + -1) + 0x10) = (x->timer_).timeout_.tv_.tv_sec;
  *(__suseconds_t *)((long)(pBVar1 + -1) + 0x18) = _Var7;
  std::function<void_()>::operator=(pBVar1,&(x->timer_).handler_);
  *(element_type **)(pBVar1 + 1) =
       (x->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&pWVar5[uVar9].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(x->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void insert(const_reference_type x) {
        if (size_ == heap.size() - 1)
            heap.resize(heap.size() * 2);

        size_type hole = ++size_;
        for (; hole > 1 && x < heap[hole / 2]; hole /= 2)
            heap[hole] = heap[hole / 2];
        heap[hole] = x;
    }